

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O0

void Inta_ManWatchClause(Inta_Man_t *p,Sto_Cls_t *pClause,lit Lit)

{
  Sto_Cls_t **ppSVar1;
  int iVar2;
  lit lVar3;
  lit Lit_local;
  Sto_Cls_t *pClause_local;
  Inta_Man_t *p_local;
  
  iVar2 = lit_check(Lit,p->pCnf->nVars);
  if (iVar2 == 0) {
    __assert_fail("lit_check(Lit, p->pCnf->nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterA.c"
                  ,0x15a,"void Inta_ManWatchClause(Inta_Man_t *, Sto_Cls_t *, lit)");
  }
  if (*(int *)&pClause[1].pNext == Lit) {
    ppSVar1 = p->pWatches;
    lVar3 = lit_neg(Lit);
    pClause->pNext0 = ppSVar1[lVar3];
  }
  else {
    if (*(int *)((long)&pClause[1].pNext + 4) != Lit) {
      __assert_fail("pClause->pLits[1] == Lit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterA.c"
                    ,0x15f,"void Inta_ManWatchClause(Inta_Man_t *, Sto_Cls_t *, lit)");
    }
    ppSVar1 = p->pWatches;
    lVar3 = lit_neg(Lit);
    pClause->pNext1 = ppSVar1[lVar3];
  }
  ppSVar1 = p->pWatches;
  lVar3 = lit_neg(Lit);
  ppSVar1[lVar3] = pClause;
  return;
}

Assistant:

static inline void Inta_ManWatchClause( Inta_Man_t * p, Sto_Cls_t * pClause, lit Lit )
{
    assert( lit_check(Lit, p->pCnf->nVars) );
    if ( pClause->pLits[0] == Lit )
        pClause->pNext0 = p->pWatches[lit_neg(Lit)];  
    else
    {
        assert( pClause->pLits[1] == Lit );
        pClause->pNext1 = p->pWatches[lit_neg(Lit)];  
    }
    p->pWatches[lit_neg(Lit)] = pClause;
}